

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::_q_startOperation(QNetworkReplyImplPrivate *this)

{
  bool bVar1;
  QDebug *o;
  ulong uVar2;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QNetworkReplyImplPrivate *errorMessage;
  undefined4 in_stack_ffffffffffffff30;
  NetworkError in_stack_ffffffffffffff34;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff40;
  char local_b0 [24];
  undefined6 in_stack_ffffffffffffff68;
  QChar in_stack_ffffffffffffff6e;
  QChar local_8a [13];
  char local_70 [80];
  QDebug local_20;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->state == Working) || (in_RDI->state == Finished)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)in_RDI,(int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38,
                           (char *)CONCAT26(in_stack_ffffffffffffff6e.ucs,in_stack_ffffffffffffff68)
                          );
    QDebug::QDebug(&local_18,o);
    ::operator<<((QDebug *)&local_10,(QUrl *)&local_18);
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug(&local_20);
  }
  else {
    in_RDI->state = Working;
    if (in_RDI->backend == (QNetworkAccessBackend *)0x0) {
      QCoreApplication::translate(local_70,"QNetworkReply","Protocol \"%1\" is unknown",0);
      QUrl::scheme();
      QChar::QChar<char16_t,_true>(local_8a,L' ');
      QString::arg<QString,_true>
                (in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff34,in_stack_ffffffffffffff6e);
      error(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,(QString *)in_RDI);
      QString::~QString((QString *)0x1e9cc9);
      QString::~QString((QString *)0x1e9cd3);
      QString::~QString((QString *)0x1e9cdd);
      finished(in_stack_ffffffffffffff38);
    }
    else {
      errorMessage = in_RDI;
      uVar2 = (**(code **)(*(long *)in_RDI->backend + 0x60))();
      if ((uVar2 & 1) == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (char *)errorMessage,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        QMessageLogger::warning(local_b0,"Backend start failed");
        in_RDI->state = Working;
        QCoreApplication::translate
                  (&stack0xffffffffffffff38,"QNetworkReply","backend start error.",0);
        error(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,(QString *)errorMessage);
        QString::~QString((QString *)0x1e9d7b);
        finished(in_stack_ffffffffffffff38);
      }
      else {
        QElapsedTimer::start();
        QElapsedTimer::invalidate();
        if ((in_RDI->backend == (QNetworkAccessBackend *)0x0) ||
           (bVar1 = QNetworkAccessBackend::isSynchronous((QNetworkAccessBackend *)0x1e9dcc), !bVar1)
           ) {
          if (in_RDI->state != Finished) {
            if ((in_RDI->super_QNetworkReplyPrivate).operation == GetOperation) {
              std::
              vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
              ::push_back((vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
                           *)in_RDI,
                          (value_type *)
                          CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
            }
            handleNotifications(in_stack_ffffffffffffff38);
          }
        }
        else {
          in_RDI->state = Finished;
          q_func(in_RDI);
          QNetworkReply::setFinished((QNetworkReply *)in_RDI,(bool)in_stack_ffffffffffffff1f);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::_q_startOperation()
{
    // ensure this function is only being called once
    if (state == Working || state == Finished) {
        qDebug() << "QNetworkReplyImpl::_q_startOperation was called more than once" << url;
        return;
    }
    state = Working;

    // note: if that method is called directly, it cannot happen that the backend is 0,
    // because we just checked via a qobject_cast that we got a http backend (see
    // QNetworkReplyImplPrivate::setup())
    if (!backend) {
        error(QNetworkReplyImpl::ProtocolUnknownError,
              QCoreApplication::translate("QNetworkReply", "Protocol \"%1\" is unknown").arg(url.scheme())); // not really true!;
        finished();
        return;
    }

    if (!backend->start()) {
        qWarning("Backend start failed");
        state = Working;
        error(QNetworkReplyImpl::UnknownNetworkError,
              QCoreApplication::translate("QNetworkReply", "backend start error."));
        finished();
        return;
    }

    // Prepare timer for progress notifications
    downloadProgressSignalChoke.start();
    uploadProgressSignalChoke.invalidate();

    if (backend && backend->isSynchronous()) {
        state = Finished;
        q_func()->setFinished(true);
    } else {
        if (state != Finished) {
            if (operation == QNetworkAccessManager::GetOperation)
                pendingNotifications.push_back(NotifyDownstreamReadyWrite);

            handleNotifications();
        }
    }
}